

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreTemplate.cc
# Opt level: O3

uint8_t * __thiscall PowerCore::fetchBlock(PowerCore *this,uint32_t blockAddr)

{
  uint8_t *puVar1;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  iterator iVar11;
  ostream *poVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  void *pvVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  undefined2 uVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  bool bVar28;
  uint uVar29;
  bool bVar30;
  uint32_t addr;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>,_bool>
  pVar38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  void **opcodes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_68;
  undefined1 local_59;
  uint local_58;
  undefined1 local_51;
  uint local_50;
  uint local_4c;
  undefined1 local_46;
  undefined1 local_45;
  uint local_44;
  undefined1 local_3d;
  uint32_t local_3c;
  void **local_38;
  uint uVar3;
  
  local_3c = blockAddr;
  iVar11 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->blocks)._M_h,&local_3c);
  if (iVar11.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return *(uint8_t **)
            ((long)iVar11.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                   ._M_cur + 0x10);
  }
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->getNextBreakpoint == (_func_uint32_t_uint32_t *)0x0) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = (*this->getNextBreakpoint)(local_3c);
  }
  local_68 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->blocks;
  interpret2(this,&local_38);
  addr = local_3c;
LAB_00109b98:
  if (addr == uVar10) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + -0x10) = local_38[-1];
    *(uint32_t *)
     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish + -8) = addr;
    uVar10 = (*this->getNextBreakpoint)(addr + 4);
  }
  uVar16 = *(uint *)((long)this->memoryBases[addr >> 0x1e] + (ulong)addr);
  uVar2 = uVar16 >> 0x18;
  uVar29 = (uVar16 & 0xff0000) >> 8;
  uVar3 = uVar2 | uVar29;
  uVar4 = (uVar16 & 0xff00) << 8;
  uVar27 = uVar3 | uVar4;
  uVar5 = uVar16 << 0x18;
  uVar22 = uVar27 | uVar5;
  uVar15 = uVar22 & 0xfc0007ff;
  bVar18 = (byte)((uVar16 & 0xff00) >> 8);
  if (0x7c000413 < (int)uVar15) {
    if ((int)uVar15 < 0x7c000515) {
      if (uVar15 == 0x7c000414) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[4];
      }
      else if (uVar15 == 0x7c000415) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[6];
      }
      else {
        if (uVar15 != 0x7c000514) goto LAB_00109f3d;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[8];
      }
    }
    else if ((int)uVar15 < 0x7c000615) {
      if (uVar15 == 0x7c000515) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[10];
      }
      else {
        if (uVar15 != 0x7c000614) goto LAB_00109f3d;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = *local_38;
      }
    }
    else {
      if (uVar15 != 0x7c000615) {
        if (uVar15 == 0x7c000714) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar13 = (byte)(uVar22 >> 0xb);
          bVar20 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0xc];
        }
        else {
          if (uVar15 != 0x7c000715) goto LAB_00109f3d;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar13 = (byte)(uVar22 >> 0xb);
          bVar20 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0xe];
        }
        goto LAB_0010ed16;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[2];
    }
    goto LAB_00109eed;
  }
  if ((int)uVar15 < 0x7c000115) {
    if (uVar15 == 0x7c000014) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[7];
    }
    else if (uVar15 == 0x7c000015) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[5];
    }
    else {
      if (uVar15 != 0x7c000114) goto LAB_00109f3d;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0xb];
    }
    goto LAB_00109eed;
  }
  if (0x7c000214 < (int)uVar15) {
    if (uVar15 != 0x7c000215) {
      if (uVar15 == 0x7c000314) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0xb);
        bVar20 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0xf];
      }
      else {
        if (uVar15 != 0x7c000315) goto LAB_00109f3d;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0xb);
        bVar20 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0xd];
      }
      goto LAB_0010ed16;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[1];
    goto LAB_00109eed;
  }
  if (uVar15 == 0x7c000115) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[9];
    goto LAB_00109eed;
  }
  if (uVar15 == 0x7c000214) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[3];
    goto LAB_00109eed;
  }
LAB_00109f3d:
  uVar21 = (undefined2)uVar3;
  switch(uVar22 + 0xd0000000 >> 0x1a) {
  case 0:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[0x13];
    break;
  case 1:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[0x12];
    break;
  case 2:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[0x11];
    break;
  case 3:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_88,
               (size_type)
               (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)));
    bVar13 = (byte)(uVar22 >> 0x15);
    pvVar17 = local_38[0x10];
    break;
  default:
    uVar23 = uVar22 & 0xfc00ffff;
    bVar13 = bVar18;
    if (0x7c000593 < (int)uVar23) {
      if ((int)uVar23 < 0x7c0005d4) {
        if (uVar23 == 0x7c000594) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar18 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0x1c];
        }
        else {
          if (uVar23 != 0x7c000595) goto LAB_0010a251;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar18 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0x1e];
        }
      }
      else if ((int)uVar23 < 0x7c0005d5) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar18 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x14];
      }
      else {
        if (uVar23 != 0x7c0005d5) {
          if (uVar23 == 0x7c0007d4) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x18];
          }
          else {
            if (uVar23 != 0x7c0007d5) goto LAB_0010a251;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x1a];
          }
          goto LAB_0010ee1a;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar18 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x16];
      }
LAB_0010a20b:
      *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -0x10) = pvVar17;
      bVar18 = bVar18 & 0x1f;
LAB_0010a212:
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish[-8] = bVar18;
LAB_0010a215:
      bVar13 = bVar13 & 0x1f;
LAB_0010a218:
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish[-7] = bVar13;
      goto LAB_00109f03;
    }
    if (0x7c0001d3 < (int)uVar23) {
      if ((int)uVar23 < 0x7c0001d5) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar18 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x17];
      }
      else {
        if (uVar23 != 0x7c0001d5) {
          if (uVar23 == 0x7c0003d4) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x1b];
          }
          else {
            if (uVar23 != 0x7c0003d5) goto LAB_0010a251;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x19];
          }
          goto LAB_0010ee1a;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar18 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x15];
      }
      goto LAB_0010a20b;
    }
    if (uVar23 == 0x7c000194) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar18 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x1f];
      goto LAB_0010a20b;
    }
    if (uVar23 == 0x7c000195) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar18 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x1d];
      goto LAB_0010a20b;
    }
LAB_0010a251:
    if (0x7c000077 < (int)uVar15) {
      if (uVar15 == 0x7c000078) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x23];
      }
      else {
        if (uVar15 != 0x7c000079) goto LAB_0010a2e7;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x22];
      }
      goto LAB_00109eed;
    }
    if (uVar15 == 0x7c000038) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x21];
      goto LAB_00109eed;
    }
    if (uVar15 == 0x7c000039) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x20];
      goto LAB_00109eed;
    }
LAB_0010a2e7:
    uVar7 = uVar5 & 0xfc000000;
    if (uVar7 == 0x70000000) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x25];
      break;
    }
    if (uVar7 == 0x74000000) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x24];
      break;
    }
    uVar25 = uVar22 & 0xfc000003;
    if (0x47ffffff < (int)uVar25) {
      switch(uVar25) {
      case 0x48000000:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        uVar16 = uVar22 >> 2 & 0xffffff;
        pvVar17 = local_38[0x29];
        break;
      case 0x48000001:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        uVar16 = uVar22 >> 2 & 0xffffff;
        pvVar17 = local_38[0x27];
        break;
      case 0x48000002:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        uVar16 = uVar22 >> 2 & 0xffffff;
        pvVar17 = local_38[0x26];
        break;
      case 0x48000003:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        uVar16 = uVar22 >> 2 & 0xffffff;
        pvVar17 = local_38[0x28];
        break;
      default:
        switch(uVar25) {
        case 0x58000000:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          uVar16 = uVar22 >> 2 & 0xffffff;
          pvVar17 = local_38[0x2d];
          break;
        case 0x58000001:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          uVar16 = uVar22 >> 2 & 0xffffff;
          pvVar17 = local_38[0x2b];
          break;
        case 0x58000002:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          uVar16 = uVar22 >> 2 & 0xffffff;
          pvVar17 = local_38[0x2a];
          break;
        case 0x58000003:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          uVar16 = uVar22 >> 2 & 0xffffff;
          pvVar17 = local_38[0x2c];
          break;
        default:
          goto LAB_0010ef67;
        }
      }
      *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -0x10) = pvVar17;
      *(uint *)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + -4) = uVar16;
      goto LAB_0010ed2e;
    }
    switch(uVar25) {
    case 0x24000000:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x35];
      break;
    case 0x24000001:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x33];
      break;
    case 0x24000002:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x32];
      break;
    case 0x24000003:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_88,
                 (size_type)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (0x10 - (long)local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)));
      bVar13 = (byte)(uVar22 >> 0x15);
      pvVar17 = local_38[0x34];
      break;
    default:
      switch(uVar25) {
      case 0x40000000:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x31];
        break;
      case 0x40000001:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x2f];
        break;
      case 0x40000002:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x2e];
        break;
      case 0x40000003:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_88,
                   (size_type)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (0x10 - (long)local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
        bVar13 = (byte)(uVar22 >> 0x15);
        pvVar17 = local_38[0x30];
        break;
      default:
LAB_0010ef67:
        switch(uVar23) {
        case 0x4c000020:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar13 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0x3b];
          break;
        case 0x4c000021:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar13 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0x3a];
          break;
        case 0x4c000022:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar13 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0x3d];
          break;
        case 0x4c000023:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&local_88,
                     (size_type)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0x10 - (long)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start)));
          bVar13 = (byte)(uVar22 >> 0x15);
          pvVar17 = local_38[0x3c];
          break;
        default:
          switch(uVar23) {
          case 0x4c000420:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x37];
            break;
          case 0x4c000421:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x36];
            break;
          case 0x4c000422:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x39];
            break;
          case 0x4c000423:
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_88,
                       (size_type)
                       (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish +
                       (0x10 - (long)local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start)));
            bVar13 = (byte)(uVar22 >> 0x15);
            pvVar17 = local_38[0x38];
            break;
          default:
            uVar25 = uVar22 & 0xfc6007ff;
            if (uVar25 == 0x7c000000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x3f];
LAB_0010a4b2:
              *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-6] = bVar13 & 7;
              bVar13 = (byte)(uVar22 >> 0xb);
LAB_0010a4bc:
              bVar18 = bVar18 & 0x1f;
LAB_0010a4bf:
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-8] = bVar18;
              goto LAB_0010a215;
            }
            if (uVar25 == 0x7c200000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x3e];
              goto LAB_0010a4b2;
            }
            uVar26 = uVar22 & 0xfc600000;
            if (uVar26 == 0x2c000000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x41];
LAB_0010a53b:
              *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-5] = bVar13 & 7;
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-6] = bVar18 & 0x1f;
              goto LAB_0010a024;
            }
            if (uVar26 == 0x2c200000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x40];
              goto LAB_0010a53b;
            }
            if (uVar25 == 0x7c000040) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x43];
              goto LAB_0010a4b2;
            }
            if (uVar25 == 0x7c200040) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x42];
              goto LAB_0010a4b2;
            }
            if (uVar26 == 0x28000000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x45];
              goto LAB_0010a53b;
            }
            if (uVar26 == 0x28200000) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x17);
              pvVar17 = local_38[0x44];
              goto LAB_0010a53b;
            }
            if (0x7c000034 < (int)uVar23) {
              if (uVar23 != 0x7c000035) {
                if (uVar23 == 0x7c000074) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar13 = (byte)(uVar22 >> 0x15);
                  pvVar17 = local_38[0x49];
                }
                else {
                  if (uVar23 != 0x7c000075) goto LAB_0010a6be;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar13 = (byte)(uVar22 >> 0x15);
                  pvVar17 = local_38[0x48];
                }
                break;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar18 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x46];
              goto LAB_0010a20b;
            }
            if (uVar23 == 0x7c000034) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar18 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x47];
              goto LAB_0010a20b;
            }
LAB_0010a6be:
            switch((uVar15 + 0xb3ffffbe) * 0x4000000 | uVar15 + 0xb3ffffbe >> 6) {
            case 0:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x4e];
              break;
            default:
              uVar25 = uVar27 & 0xffe007ff | uVar5;
              if ((int)uVar25 < 0x7c0000bc) {
                if (uVar25 == 0x7c00006c) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar17 = local_38[0x59];
                }
                else if (uVar25 == 0x7c00007c) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar17 = local_38[0x58];
                }
                else {
                  if (uVar25 != 0x7c0000ac) goto LAB_0010aa03;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar17 = local_38[0x55];
                }
LAB_0010a9e2:
                bVar13 = (byte)(uVar22 >> 0xb);
                *(void **)(local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                goto LAB_0010a212;
              }
              if ((int)uVar25 < 0x7c0005ec) {
                if (uVar25 != 0x7c0000bc) {
                  if (uVar25 == 0x7c0003ac) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    pvVar17 = local_38[0x57];
                  }
                  else {
                    if (uVar25 != 0x7c0003bc) goto LAB_0010aa03;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    pvVar17 = local_38[0x56];
                  }
                  goto LAB_0010f3aa;
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                pvVar17 = local_38[0x54];
                goto LAB_0010a9e2;
              }
              if (uVar25 == 0x7c0005ec) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                pvVar17 = local_38[0x53];
                goto LAB_0010a9e2;
              }
              if (uVar25 == 0x7c0005fc) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                pvVar17 = local_38[0x52];
                goto LAB_0010a9e2;
              }
LAB_0010aa03:
              switch((uVar15 + 0x83fffe14) * 0x10000000 | uVar15 + 0x83fffe14 >> 4) {
              case 0:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar13 = (byte)(uVar22 >> 0x15);
                pvVar17 = local_38[0x5d];
                break;
              case 1:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar13 = (byte)(uVar22 >> 0x15);
                pvVar17 = local_38[0x5c];
                break;
              default:
                if (uVar25 == 0x7c0007ec) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar17 = local_38[0x5f];
LAB_0010f3aa:
                  bVar18 = (byte)(uVar22 >> 0xb);
                  *(void **)(local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                  goto LAB_0010ee21;
                }
                if (uVar25 == 0x7c0007fc) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  pvVar17 = local_38[0x5e];
                  goto LAB_0010f3aa;
                }
                if ((int)uVar15 < 0x7c0003d2) {
                  switch(uVar15) {
                  case 0x7c000392:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x67];
                    goto LAB_0010ed16;
                  case 0x7c000393:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x65];
                    goto LAB_0010ed16;
                  case 0x7c000394:
                  case 0x7c000395:
                    goto switchD_0010aace_caseD_7c000394;
                  case 0x7c000396:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x6f];
                    break;
                  case 0x7c000397:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x6d];
                    break;
                  default:
                    if (uVar15 == 0x7c000238) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x71];
                    }
                    else {
                      if (uVar15 != 0x7c000239) goto switchD_0010aace_caseD_7c000394;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x70];
                    }
                  }
                  break;
                }
                switch(uVar15) {
                case 0x7c0003d2:
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar13 = (byte)(uVar22 >> 0xb);
                  bVar20 = (byte)(uVar22 >> 0x15);
                  pvVar17 = local_38[99];
                  goto LAB_0010ed16;
                case 0x7c0003d3:
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar13 = (byte)(uVar22 >> 0xb);
                  bVar20 = (byte)(uVar22 >> 0x15);
                  pvVar17 = local_38[0x61];
                  goto LAB_0010ed16;
                case 0x7c0003d4:
                case 0x7c0003d5:
switchD_0010aace_caseD_7c000394:
                  if (0x7c000773 < (int)uVar23) {
                    if ((int)uVar23 < 0x7c000775) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x73];
                    }
                    else {
                      if (uVar23 != 0x7c000775) {
                        if (uVar23 == 0x7c0007b4) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x77];
                        }
                        else {
                          if (uVar23 != 0x7c0007b5) goto LAB_0010aeb5;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x76];
                        }
                        goto LAB_0010ee1a;
                      }
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x72];
                    }
                    goto LAB_0010a20b;
                  }
                  if (uVar23 == 0x7c000734) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x75];
                    goto LAB_0010a20b;
                  }
                  if (uVar23 == 0x7c000735) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x74];
                    goto LAB_0010a20b;
                  }
LAB_0010aeb5:
                  local_44 = uVar3 & 0x7fe;
                  bVar20 = (byte)(uVar16 >> 0x18);
                  bVar31 = 0xfbffffff < uVar22;
                  bVar28 = (uVar4 & 0x1f0000) == 0;
                  bVar30 = bVar28 && bVar31;
                  local_58 = CONCAT31(local_58._1_3_,bVar30);
                  if ((local_44 == 0x210 && (bVar28 && bVar31)) && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x78];
LAB_0010af61:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar18 & 0x1f;
                    goto LAB_0010a218;
                  }
                  if (((~(local_44 == 0x210 && bVar30) | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x79];
                    goto LAB_0010af61;
                  }
                  bVar32 = 0xdfffffff < uVar22;
                  bVar35 = (uVar5 & 0x1c000000) == 0x1c000000;
                  local_51 = bVar35 && bVar32;
                  bVar8 = (uVar3 & 0x7c0) == 0;
                  local_45 = bVar8 && (bool)local_51;
                  local_50 = uVar2 & 0x3e;
                  if (((uVar2 & 1) == 0) && (local_50 == 0x2a && (bVar8 && (bVar35 && bVar32)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x7a];
                    break;
                  }
                  bVar9 = (uVar3 & 0x7c0) == 0;
                  bVar33 = 0xdfffffff < uVar22;
                  bVar36 = (uVar5 & 0x1c000000) == 0xc000000;
                  local_59 = bVar36 && bVar33;
                  local_46 = bVar9 && (bool)local_59;
                  if (((uVar2 & 1) != 0) && (local_50 == 0x2a && (bVar9 && (bVar36 && bVar33)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x7b];
                    break;
                  }
                  if (((uVar2 & 1) != 0) && (local_50 == 0x2a && (bVar8 && (bVar35 && bVar32)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x7c];
                    break;
                  }
                  if (((~(local_50 == 0x2a && (bool)local_46) | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x7d];
                    break;
                  }
                  if (bVar30 && (uVar2 | uVar29 & 0x7ff) == 0x69c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x7e];
                    goto LAB_00111031;
                  }
                  bVar34 = 0xfbffffff < uVar22;
                  bVar6 = (uVar4 & 0x600000) == 0;
                  local_3d = bVar6 && bVar34;
                  bVar37 = (uVar3 & 0x780) == 0;
                  if ((uVar2 & 0x7f) == 0x40 && (bVar37 && (bVar6 && bVar34))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x17);
                    pvVar17 = local_38[0x7f];
                    goto LAB_0010a4b2;
                  }
                  if ((uVar2 & 0x7f) == 0 && (bVar37 && (bVar6 && bVar34))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x17);
                    pvVar17 = local_38[0x80];
                    goto LAB_0010a4b2;
                  }
                  uVar29 = uVar3 & 0x7fc;
                  if ((((uVar2 & 1) == 0) && (uVar29 == 0x65c && (bVar28 && bVar31))) &&
                     ((uVar2 & 2) != 0)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x81];
                    goto LAB_0010af61;
                  }
                  if ((uVar29 == 0x65c && (bVar28 && bVar31)) && (uVar2 & 3) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x82];
                    goto LAB_0010af61;
                  }
                  bVar6 = (uVar2 & 2) != 0;
                  bVar37 = uVar29 == 0x1c;
                  if (((uVar2 & 1) == 0) && ((bVar37 && (bVar28 && bVar31)) && bVar6)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x83];
                    goto LAB_0010af61;
                  }
                  bVar34 = (uVar2 & 2) == 0 && (bVar37 && bVar30);
                  if (((uVar2 & 1) != 0) && (bVar34)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x84];
                    goto LAB_0010af61;
                  }
                  if ((uVar2 & 1) != 0 && ((bVar37 && (bVar28 && bVar31)) && bVar6)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x85];
                    goto LAB_0010af61;
                  }
                  if (((~bVar34 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x86];
                    goto LAB_0010af61;
                  }
                  if (((uVar2 & 1) == 0) && (local_50 == 0x24 && (bVar8 && (bVar35 && bVar32)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x87];
                    break;
                  }
                  if (((uVar2 & 1) != 0) && (local_50 == 0x24 && (bVar9 && (bVar36 && bVar33)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x88];
                    break;
                  }
                  if (((uVar2 & 1) != 0) && (local_50 == 0x24 && (bVar8 && (bVar35 && bVar32)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x89];
                    break;
                  }
                  if (((~(local_50 == 0x24 && (bool)local_46) | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x8a];
                    break;
                  }
                  bVar28 = local_50 == 0x3a && (bool)local_51;
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x8b];
LAB_0010bc2c:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
LAB_0010bc79:
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-7] = bVar18 & 0x1f;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-6] = (byte)(uVar22 >> 0xb) & 0x1f;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-5] = (byte)(uVar22 >> 6) & 0x1f;
                    goto LAB_00109f03;
                  }
                  bVar31 = local_50 == 0x3a && (bool)local_59;
                  if (bVar31 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x8c];
                    goto LAB_0010bc2c;
                  }
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x8d];
                    goto LAB_0010bc2c;
                  }
                  if (((~bVar31 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x8e];
                    goto LAB_0010bc2c;
                  }
                  bVar28 = local_44 == 0x90 && bVar30;
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x8f];
                    goto LAB_0010af61;
                  }
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x90];
                    goto LAB_0010af61;
                  }
                  bVar28 = local_50 == 0x38 && (bool)local_51;
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x91];
                    goto LAB_0010bc2c;
                  }
                  bVar31 = local_50 == 0x38 && (bool)local_59;
                  if (bVar31 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x92];
                    goto LAB_0010bc2c;
                  }
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x93];
                    goto LAB_0010bc2c;
                  }
                  if (((~bVar31 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x94];
                    goto LAB_0010bc2c;
                  }
                  bVar28 = (uVar3 & 0xf83e) == 0x32 && (bool)local_51;
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 6);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x95];
LAB_0010b8bc:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar20 & 0x1f;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-7] = bVar18 & 0x1f;
                    goto LAB_00109f00;
                  }
                  bVar31 = (uVar3 & 0xf83e) == 0x32 && (bool)local_59;
                  if (bVar31 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 6);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x96];
                    goto LAB_0010b8bc;
                  }
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 6);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x97];
                    goto LAB_0010b8bc;
                  }
                  if (((~bVar31 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 6);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x98];
                    goto LAB_0010b8bc;
                  }
                  bVar28 = local_44 == 0x110 && bVar30;
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x99];
                    goto LAB_0010af61;
                  }
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x9a];
                    goto LAB_0010af61;
                  }
                  bVar28 = local_44 == 0x50 && bVar30;
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x9b];
                    goto LAB_0010af61;
                  }
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x9c];
                    goto LAB_0010af61;
                  }
                  bVar28 = local_50 == 0x3e && (bool)local_51;
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x9d];
                    goto LAB_0010bc2c;
                  }
                  bVar31 = local_50 == 0x3e && (bool)local_59;
                  if (bVar31 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x9e];
                    goto LAB_0010bc2c;
                  }
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x9f];
                    goto LAB_0010bc2c;
                  }
                  if (((~bVar31 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa0];
                    goto LAB_0010bc2c;
                  }
                  bVar28 = local_50 == 0x3c && (bool)local_51;
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa1];
                    goto LAB_0010bc2c;
                  }
                  bVar31 = local_50 == 0x3c && (bool)local_59;
                  if (bVar31 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa2];
                    goto LAB_0010bc2c;
                  }
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa3];
LAB_0010bc6d:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
                    goto LAB_0010bc79;
                  }
                  if (((~bVar31 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa4];
                    goto LAB_0010bc6d;
                  }
                  local_4c = uVar22 & 0xfc1f07ff;
                  if (local_4c == 0xec000030) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa6];
LAB_00111031:
                    bVar18 = (byte)(uVar22 >> 0xb);
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-4] = bVar13 & 0x1f;
                    goto LAB_0010ee27;
                  }
                  if (local_4c == 0xec000031) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa5];
                    goto LAB_00111031;
                  }
                  bVar28 = local_44 == 0x18 && bVar30;
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa7];
LAB_0010cb26:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar18 & 0x1f;
                    goto LAB_0010a218;
                  }
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa8];
                    goto LAB_0010cb26;
                  }
                  bVar30 = local_44 == 0x34 && bVar30;
                  if (bVar30 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xa9];
                    goto LAB_00111031;
                  }
                  if (((~bVar30 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xaa];
                    goto LAB_00111031;
                  }
                  if ((local_50 == 0x2e && 0xfbffffff < uVar22) && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 6);
                    bVar20 = (byte)(uVar22 >> 0xb);
                    bVar19 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xab];
                    goto LAB_0011117f;
                  }
                  if (((~(local_50 == 0x2e && 0xfbffffff < uVar22) | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 6);
                    bVar20 = (byte)(uVar22 >> 0xb);
                    bVar19 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xac];
                    goto LAB_0011117f;
                  }
                  bVar28 = (uVar27 & 0x1f07fe) == 0x2c && (bool)local_51;
                  if (((~bVar28 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xad];
                    goto LAB_00111031;
                  }
                  bVar30 = (uVar27 & 0x1f07fe) == 0x2c && (bool)local_59;
                  if (bVar30 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xae];
                    goto LAB_00111031;
                  }
                  if (bVar28 && (uVar2 & 1) != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xaf];
                    goto LAB_00111031;
                  }
                  if (((~bVar30 | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb0];
                    goto LAB_00111031;
                  }
                  if (((uVar2 & 1) == 0) && (local_50 == 0x28 && (bVar8 && (bVar35 && bVar32)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb1];
                    goto LAB_0010eb46;
                  }
                  if (((uVar2 & 1) != 0) && (local_50 == 0x28 && (bVar9 && (bVar36 && bVar33)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb2];
                    goto LAB_0010eb46;
                  }
                  if (((uVar2 & 1) != 0) && (local_50 == 0x28 && (bVar8 && (bVar35 && bVar32)))) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb3];
                    goto LAB_0010eb46;
                  }
                  if (((~(local_50 == 0x28 && (bool)local_46) | bVar20) & 1) == 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb4];
                    goto LAB_0010eb46;
                  }
                  if (uVar25 == 0x7c0007ac) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = local_38[0xb5];
                    goto LAB_0010a4bf;
                  }
                  if (uVar15 == 0x7c00002c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb6];
                    goto LAB_0010eb46;
                  }
                  if (uVar16 == 0x2c01004c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (8 - (long)local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start)));
                    pvVar17 = local_38[0xb7];
                    goto LAB_0010ebfe;
                  }
                  uVar29 = uVar22 & 0xfc1f0000;
                  if (uVar29 == 0x8c000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb8];
                    goto LAB_0010cb70;
                  }
                  if (uVar7 == 0x8c000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xba];
LAB_0010ebbf:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    bVar13 = bVar13 & 0x1f;
LAB_0010ebc6:
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-6] = bVar13;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-5] = bVar18 & 0x1f;
LAB_0010ebcf:
                    *(undefined2 *)
                     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + -8) = uVar21;
                    goto LAB_00109f03;
                  }
                  if (uVar7 == 0x88000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xb9];
                    goto LAB_0010ebbf;
                  }
                  local_58 = uVar22 & 0xfc00000f;
                  if (local_58 == 0xe8000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xbd];
LAB_001111f8:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-2] = bVar13 & 0x1f;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1] = bVar18 & 0x1f;
                    uVar14 = (ushort)(uVar3 >> 4);
                    goto LAB_0010f1dd;
                  }
                  if (local_58 == 0xe8000001) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xbc];
                    goto LAB_001111f8;
                  }
                  if (uVar15 == 0x7c0000ae) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xbe];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0000ee) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xbf];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c0000ee) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc0];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0000ae) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc1];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c0000be) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc3];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c0003be) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc4];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c0000fe) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc2];
                    goto LAB_0010ed16;
                  }
                  if (local_58 == 0xf8000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc6];
                    goto LAB_001111f8;
                  }
                  if (local_58 == 0xf8000001) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc5];
                    goto LAB_001111f8;
                  }
                  if (uVar15 == 0x7c00063e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[200];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c00067e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[199];
                    goto LAB_0010ed16;
                  }
                  if (uVar29 == 0xcc000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xc9];
LAB_0010cb70:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-6] = bVar18 & 0x1f;
                    goto LAB_0010ebcf;
                  }
                  if (uVar7 == 0xcc000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xcb];
                    goto LAB_0010ebbf;
                  }
                  if (uVar7 == 0xc8000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xca];
                    goto LAB_0010ebbf;
                  }
                  if (local_58 == 0xf8000006) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xce];
                    goto LAB_001111f8;
                  }
                  if (local_58 == 0xf8000007) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xcd];
                    goto LAB_001111f8;
                  }
                  if (uVar15 == 0x7c0004ae) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xcf];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0004ee) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd0];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c0004ee) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd1];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0004ae) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd2];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c0004be) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd4];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c0004fe) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd3];
                    goto LAB_0010ed16;
                  }
                  if (uVar29 == 0xc4000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd5];
                    goto LAB_0010cb70;
                  }
                  if (uVar7 == 0xc4000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd7];
                    goto LAB_0010ebbf;
                  }
                  if (uVar7 == 0xc0000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd6];
LAB_0010e6f1:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    goto LAB_0010ebc6;
                  }
                  if (local_58 == 0xf8000004) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xda];
                    goto LAB_001111f8;
                  }
                  if (local_58 == 0xf8000005) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xd9];
                    goto LAB_001111f8;
                  }
                  if (uVar15 == 0x7c00042e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xdb];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c00046e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xdc];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00046e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xdd];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c00042e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xde];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00043e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe0];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c00047e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xdf];
                    goto LAB_0010ed16;
                  }
                  if (uVar29 == 0xac000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe1];
                    goto LAB_0010cb70;
                  }
                  if (uVar7 == 0xac000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe3];
                    goto LAB_0010ebbf;
                  }
                  if (uVar7 == 0xa8000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe2];
                    goto LAB_0010ebbf;
                  }
                  if (local_58 == 0xe8000004) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe6];
                    goto LAB_001111f8;
                  }
                  if (local_58 == 0xe8000005) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe5];
                    goto LAB_001111f8;
                  }
                  if (uVar15 == 0x7c0002ae) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe7];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0002ee) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe8];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c0002ee) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xe9];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0002ae) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xea];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00062c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xed];
                    goto LAB_0010eb46;
                  }
                  if (uVar15 == 0x7c0002be) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xec];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c0002fe) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xeb];
                    goto LAB_0010ed16;
                  }
                  if (local_4c == 0x7c00062c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xee];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00063c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xef];
                    goto LAB_0010ed16;
                  }
                  if (uVar29 == 0xa4000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf0];
                    goto LAB_0010cb70;
                  }
                  if (uVar7 == 0xa4000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf2];
                    goto LAB_0010ebbf;
                  }
                  if (uVar7 == 0xa0000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf1];
                    goto LAB_0010e6f1;
                  }
                  if (local_58 == 0xe8000002) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf5];
                    goto LAB_001111f8;
                  }
                  if (local_58 == 0xe8000003) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf4];
                    goto LAB_001111f8;
                  }
                  if (uVar15 == 0x7c00022e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf6];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c00026e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf7];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00026e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf8];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c00022e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xf9];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00023e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xfb];
                    goto LAB_0010ed16;
                  }
                  if (uVar15 == 0x7c00027e) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xfa];
                    goto LAB_0010ed16;
                  }
                  if (uVar7 == 0xb8000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xfc];
                    goto LAB_0010ebbf;
                  }
                  if (uVar15 == 0x7c0004aa) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xfe];
                    goto LAB_0010eb46;
                  }
                  if (local_4c == 0x7c0004aa) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0xff];
                    goto LAB_0010cb26;
                  }
                  if (0x7c000429 < (int)uVar15) {
                    if (uVar15 != 0x7c00042c) {
                      if (uVar15 != 0x7c00042a) goto LAB_0010caf1;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0xb);
                      bVar20 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x100];
                      goto LAB_0010ed16;
                    }
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x103];
                    goto LAB_0010eb46;
                  }
                  if (uVar15 == 0x7c000028) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x101];
                    goto LAB_0010eb46;
                  }
                  if (uVar15 == 0x7c0000fc) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x102];
                    goto LAB_0010ed16;
                  }
LAB_0010caf1:
                  if (local_4c == 0x7c00042c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x104];
                    goto LAB_0010cb26;
                  }
                  if (uVar15 == 0x7c00043c) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x105];
                    goto LAB_0010ed16;
                  }
                  if (uVar29 == 0x84000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar18 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x106];
                    goto LAB_0010cb70;
                  }
                  if (uVar7 == 0x84000000) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x108];
                    goto LAB_0010ebbf;
                  }
                  if (local_58 == 0xe8000006) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x10b];
                    goto LAB_001111f8;
                  }
                  if (local_58 == 0xe8000007) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x10a];
                    goto LAB_001111f8;
                  }
                  switch((uVar15 + 0x83ffffd2) * 0x10000000 | uVar15 + 0x83ffffd2 >> 4) {
                  case 0:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x10d];
                    goto LAB_0010eb46;
                  case 1:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x10f];
                    break;
                  default:
                    local_50 = uVar22 & 0xfc1fffff;
                    if (local_50 == 0x7c0006ac) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x110];
                      goto LAB_0010d149;
                    }
                    if ((uVar22 & 0xfc63ffff) == 0x4c000000) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) =
                           local_38[0x111];
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-8] = (byte)(uVar22 >> 0x17) & 7;
                      bVar13 = (byte)(uVar22 >> 0x12) & 7;
                      goto LAB_0010a218;
                    }
                    if ((bool)local_3d && (uVar3 | uVar4 & 0x3ffff) == 0x80) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) =
                           local_38[0x112];
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-4] = (byte)(uVar22 >> 0x17) & 7;
                      bVar18 = (byte)(uVar22 >> 0x12) & 7;
                      goto LAB_0010ee27;
                    }
                    if ((uVar22 & 0xfc7fffff) == 0x7c000440) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x114];
LAB_00110571:
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                      bVar18 = (byte)(uVar22 >> 0x17) & 7;
LAB_00110981:
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-4] = bVar18;
                      goto LAB_0010ed2e;
                    }
                    if ((uVar22 & 0xfc7fffff) == 0x7c000400) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x113];
                      goto LAB_00110571;
                    }
                    if (uVar23 == 0x7c000226) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x115];
                      goto LAB_0010ee1a;
                    }
                    if (local_50 == 0x7c000026) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x116];
                      goto LAB_0010d149;
                    }
                    if (uVar15 == 0x7c000286) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x117];
                      goto LAB_001110cf;
                    }
                    bVar30 = (uVar27 & 0x1ff800) == 0;
                    bVar31 = 0xfbffffff < uVar22;
                    bVar28 = bVar31 && bVar30;
                    if ((local_44 == 0x48e && (bVar31 && bVar30)) && (uVar2 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x118];
LAB_0010d149:
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                      bVar18 = bVar18 & 0x1f;
LAB_0010d150:
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-8] = bVar18;
                      goto LAB_00109f03;
                    }
                    if (((~(local_44 == 0x48e && bVar28) | bVar20) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x119];
                      goto LAB_0010d149;
                    }
                    if (local_50 == 0x7c0802a6) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x11b];
                      goto LAB_0010d149;
                    }
                    if (local_50 == 0x7c0902a6) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x11c];
                      goto LAB_0010d149;
                    }
                    if (local_50 == 0x7c0000a6) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x11a];
                      goto LAB_00110917;
                    }
                    if (uVar15 == 0x7c0002a6) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x11d];
LAB_001110cf:
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-2] = bVar18 & 0x1f;
                      uVar14 = (ushort)((uVar27 & 0x1ff800) >> 0xb);
                      goto LAB_0010f1dd;
                    }
                    if (uVar16 == 0xac04007c) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (8 - (long)local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x11e];
                      goto LAB_0010ebfe;
                    }
                    if ((uVar22 & 0xfc100fff) == 0x7c000120) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0xc);
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) =
                           local_38[0x11f];
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-7] = (byte)(uVar22 >> 0x15) & 0x1f;
                      goto LAB_0010d150;
                    }
                    if (uVar15 == 0x7c000386) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x120];
                      goto LAB_001110cf;
                    }
                    if ((local_44 == 0x8c && (bVar31 && bVar30)) && (uVar2 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x121];
LAB_00110917:
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                      bVar18 = (byte)(uVar22 >> 0x15) & 0x1f;
                      goto LAB_00110981;
                    }
                    if (((~(local_44 == 0x8c && bVar28) | bVar20) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x122];
                      goto LAB_00110917;
                    }
                    if ((local_44 == 0x4c && (bVar31 && bVar30)) && (uVar2 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x123];
                      goto LAB_00110917;
                    }
                    if (((~(local_44 == 0x4c && bVar28) | bVar20) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x124];
                      goto LAB_00110917;
                    }
                    bVar28 = (uVar22 & 0x20107fe) == 0x58e;
                    if ((bVar28 && 0xfbffffff < uVar22) && (uVar2 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x125];
                      bVar13 = (byte)(uVar22 >> 0x11);
                      goto LAB_0010f3aa;
                    }
                    if (((~(bVar28 && 0xfbffffff < uVar22) | bVar20) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x126];
                      bVar13 = (byte)(uVar22 >> 0x11);
                      goto LAB_0010f3aa;
                    }
                    bVar28 = (uVar27 & 0x7f0ffe) == 0x10c;
                    if ((bVar28 && 0xfbffffff < uVar22) && (uVar2 & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x17);
                      pvVar17 = local_38[0x127];
LAB_00110977:
                      bVar18 = (byte)(uVar22 >> 0xc);
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-3] = bVar13 & 7;
                      goto LAB_00110981;
                    }
                    if (((~(bVar28 && 0xfbffffff < uVar22) | bVar20) & 1) == 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x17);
                      pvVar17 = local_38[0x128];
                      goto LAB_00110977;
                    }
                    if (local_50 == 0x7c0803a6) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x12a];
                      goto LAB_0010d149;
                    }
                    if (local_50 == 0x7c0903a6) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar18 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[299];
                      goto LAB_0010d149;
                    }
                    if (local_50 == 0x7c000124) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      pvVar17 = local_38[0x129];
                      goto LAB_00110917;
                    }
                    if (0x7c000091 < (int)uVar15) {
                      if (0x7c0001d1 < (int)uVar15) {
                        if (uVar15 == 0x7c0001d2) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0xb);
                          bVar20 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x136];
                        }
                        else {
                          if (uVar15 != 0x7c0005d2) {
                            if (uVar15 == 0x7c0003a6) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar18 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[300];
                              goto LAB_001110cf;
                            }
                            goto switchD_0010d0c3_caseD_7c000094;
                          }
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0xb);
                          bVar20 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x135];
                        }
                        break;
                      }
                      switch(uVar15) {
                      case 0x7c000092:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0xb);
                        bVar20 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x12e];
                        break;
                      case 0x7c000093:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0xb);
                        bVar20 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x12d];
                        break;
                      default:
                        goto switchD_0010d0c3_caseD_7c000094;
                      case 0x7c000096:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x132];
                        goto LAB_0010eb46;
                      case 0x7c000097:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x131];
                        goto LAB_0010eb46;
                      }
                      break;
                    }
                    switch(uVar15) {
                    case 0x7c000012:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0xb);
                      bVar20 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x130];
                      break;
                    case 0x7c000013:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0xb);
                      bVar20 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x12f];
                      break;
                    default:
switchD_0010d0c3_caseD_7c000094:
                      if (uVar7 == 0x1c000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x137];
                        goto LAB_0010ebbf;
                      }
                      if (0x7c0003b8 < (int)uVar15) {
                        if (uVar15 == 0x7c0003b9) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x13c];
                        }
                        else if (uVar15 == 0x7c0005d7) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x13a];
                        }
                        else {
                          if (uVar15 != 0x7c0005d6) goto LAB_0010d403;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x138];
                        }
                        goto LAB_0010eb46;
                      }
                      if (uVar15 == 0x7c0001d6) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x13b];
                        goto LAB_0010eb46;
                      }
                      if (uVar15 == 0x7c0001d7) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x139];
                        goto LAB_0010eb46;
                      }
                      if (uVar15 == 0x7c0003b8) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x13d];
                        goto LAB_0010eb46;
                      }
LAB_0010d403:
                      if (0x7c0004cf < (int)uVar23) {
                        if (uVar23 == 0x7c0004d1) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar17 = local_38[0x140];
                        }
                        else {
                          if (uVar23 != 0x7c0004d0) goto LAB_0010d4f7;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar17 = local_38[0x13e];
                        }
LAB_0010e976:
                        bVar18 = (byte)(uVar22 >> 0x15);
                        *(void **)(local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                        goto LAB_0010a4bc;
                      }
                      if (uVar23 == 0x7c0000d0) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        pvVar17 = local_38[0x141];
                        goto LAB_0010e976;
                      }
                      if (uVar23 == 0x7c0000d1) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        pvVar17 = local_38[0x13f];
                        goto LAB_0010e976;
                      }
LAB_0010d4f7:
                      if (0x7c000338 < (int)uVar15) {
                        if (uVar15 == 0x7c000339) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x146];
                        }
                        else if (uVar15 == 0x7c000378) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x145];
                        }
                        else {
                          if (uVar15 != 0x7c000379) goto LAB_0010d685;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x144];
                        }
                        goto LAB_0010eb46;
                      }
                      if (uVar15 == 0x7c0000f8) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x143];
                        goto LAB_0010eb46;
                      }
                      if (uVar15 == 0x7c0000f9) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x142];
                        goto LAB_0010eb46;
                      }
                      if (uVar15 == 0x7c000338) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x147];
                        goto LAB_0010eb46;
                      }
LAB_0010d685:
                      if (uVar7 == 0x60000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x149];
                        goto LAB_0010e6f1;
                      }
                      if (uVar7 == 0x64000000) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x148];
                        goto LAB_0010ebbf;
                      }
                      if (uVar16 == 0x6400004c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        pvVar17 = local_38[0x14b];
                        goto LAB_001109db;
                      }
                      if (uVar16 == 0x6600004c) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        pvVar17 = local_38[0x14a];
                        goto LAB_001109db;
                      }
                      uVar27 = (uVar22 & 0xfc00003f) + 0x88000000;
                      switch(uVar27 >> 1 | (uint)((uVar27 & 1) != 0) << 0x1f) {
                      case 0:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x151];
                        break;
                      case 1:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x14f];
                        break;
                      case 2:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x157];
                        break;
                      case 3:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x155];
                        break;
                      case 4:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x15b];
                        break;
                      case 5:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x159];
                        break;
                      case 6:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x15f];
                        break;
                      case 7:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x15d];
                        break;
                      case 8:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x14d];
                        break;
                      case 9:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x153];
                        break;
                      default:
                        uVar27 = uVar22 & 0xfc000001;
                        if (0x54000000 < (int)uVar27) {
                          if (uVar27 == 0x54000001) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 6);
                            bVar19 = (byte)(uVar22 >> 0xb);
                            bVar24 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x163];
                          }
                          else if (uVar27 == 0x5c000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 6);
                            bVar19 = (byte)(uVar22 >> 0xb);
                            bVar24 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x162];
                          }
                          else {
                            if (uVar27 != 0x5c000001) goto LAB_0010d917;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 6);
                            bVar19 = (byte)(uVar22 >> 0xb);
                            bVar24 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x164];
                          }
LAB_0010d8e8:
                          *(void **)(local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-8] = bVar24 & 0x1f;
                          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-7] = bVar18 & 0x1f;
                          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-6] = bVar19 & 0x1f;
                          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-5] = bVar13 & 0x1f;
                          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-4] = bVar20 >> 1 & 0x1f;
                          goto LAB_00109f03;
                        }
                        if (uVar27 == 0x50000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 6);
                          bVar19 = (byte)(uVar22 >> 0xb);
                          bVar24 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x161];
                          goto LAB_0010d8e8;
                        }
                        if (uVar27 == 0x50000001) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 6);
                          bVar19 = (byte)(uVar22 >> 0xb);
                          bVar24 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x160];
                          goto LAB_0010d8e8;
                        }
                        if (uVar27 == 0x54000000) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 6);
                          bVar19 = (byte)(uVar22 >> 0xb);
                          bVar24 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x165];
                          goto LAB_0010d8e8;
                        }
LAB_0010d917:
                        if (uVar16 == 0x2000044) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          pvVar17 = local_38[0x166];
LAB_001109db:
                          *(void **)(local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
LAB_0010ed2e:
                          *(uint32_t *)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + -8) = addr;
                          pVar38 = std::
                                   _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                   ::
                                   _M_emplace<unsigned_int&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                             (local_68,&local_3c,&local_88);
                          puVar1 = *(uint8_t **)
                                    ((long)pVar38.first.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    + 0x10);
                          if (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                            return puVar1;
                          }
                          operator_delete(local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_88.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_88.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                          return puVar1;
                        }
                        if ((int)uVar15 < 0x7c000630) {
                          if ((int)uVar15 < 0x7c000430) {
                            if (uVar15 == 0x7c000030) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x169];
                            }
                            else {
                              if (uVar15 != 0x7c000031) {
                                if (uVar15 != 0x7c000036) goto switchD_0010d955_caseD_7c000672;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0xb);
                                bVar20 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x167];
                                goto LAB_0010ed16;
                              }
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x168];
                            }
                          }
                          else if (uVar15 == 0x7c000430) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x173];
                          }
                          else {
                            if (uVar15 != 0x7c000431) {
                              if (uVar15 != 0x7c000436) goto switchD_0010d955_caseD_7c000672;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x171];
                              goto LAB_0010ed16;
                            }
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x172];
                          }
                          goto LAB_0010eb46;
                        }
                        if ((int)uVar15 < 0x7c000670) {
                          if (uVar15 == 0x7c000630) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x170];
                          }
                          else {
                            if (uVar15 != 0x7c000631) {
                              if (uVar15 != 0x7c000634) goto switchD_0010d955_caseD_7c000672;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x16a];
                              goto LAB_0010ed16;
                            }
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x16e];
                          }
                          goto LAB_0010eb46;
                        }
                        switch(uVar15) {
                        case 0x7c000670:
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x16d];
                          goto LAB_0010eb46;
                        case 0x7c000671:
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x16f];
                          goto LAB_0010eb46;
                        default:
switchD_0010d955_caseD_7c000672:
                          if (uVar7 == 0x98000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x175];
                            goto LAB_0010ebbf;
                          }
                          if (uVar7 == 0x9c000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x174];
                            goto LAB_0010ebbf;
                          }
                          if (local_58 == 0xe8000008) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x177];
                            goto LAB_001111f8;
                          }
                          if (local_58 == 0xe8000009) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x176];
                            goto LAB_001111f8;
                          }
                          if (0x7c0001ed < (int)uVar15) {
                            if (uVar15 != 0x7c0001ee) {
                              if (uVar15 == 0x7c0001fe) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0xb);
                                bVar20 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x17a];
                              }
                              else {
                                if (uVar15 != 0x7c0003ff) goto LAB_0010dcb1;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0xb);
                                bVar20 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x17c];
                              }
                              break;
                            }
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x178];
                            goto LAB_0010eb46;
                          }
                          if (uVar15 == 0x7c0001ae) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x179];
                            goto LAB_0010eb46;
                          }
                          if (uVar15 == 0x7c0001be) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0xb);
                            bVar20 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x17b];
                            break;
                          }
LAB_0010dcb1:
                          if (local_58 == 0xf8000008) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x17e];
                            goto LAB_001111f8;
                          }
                          if (local_58 == 0xf8000009) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x17d];
                            goto LAB_001111f8;
                          }
                          if (uVar15 == 0x7c00073e) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0xb);
                            bVar20 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x180];
                            break;
                          }
                          if (uVar15 == 0x7c00077e) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0xb);
                            bVar20 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x17f];
                            break;
                          }
                          if (uVar7 == 0xd8000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x182];
                            goto LAB_0010ebbf;
                          }
                          if (uVar7 == 0xdc000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x181];
                            goto LAB_0010ebbf;
                          }
                          if (local_58 == 0xf800000e) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x184];
                            goto LAB_001111f8;
                          }
                          if (local_58 == 0xf800000f) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x183];
                            goto LAB_001111f8;
                          }
                          if ((int)uVar15 < 0x7c0005ee) {
                            if (uVar15 == 0x7c0005ae) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x186];
                              goto LAB_0010eb46;
                            }
                            if (uVar15 != 0x7c0005be) goto LAB_0010de30;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0xb);
                            bVar20 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x188];
                            break;
                          }
                          if (0x7c0005fd < (int)uVar15) {
                            if (uVar15 == 0x7c0005fe) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x187];
                            }
                            else if (uVar15 == 0x7c0007ae) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x189];
                            }
                            else {
                              if (uVar15 != 0x7c0007be) goto LAB_0010de30;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x18a];
                            }
                            break;
                          }
                          if (uVar15 == 0x7c0005ee) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x185];
                            goto LAB_0010eb46;
                          }
LAB_0010de30:
                          if (uVar7 == 0xd0000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x18c];
                            goto LAB_0010ebbf;
                          }
                          if (uVar7 == 0xd4000000) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x18b];
                            goto LAB_0010ebbf;
                          }
                          if (local_58 == 0xf800000c) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x18e];
                            goto LAB_001111f8;
                          }
                          if (local_58 == 0xf800000d) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x18d];
                            goto LAB_001111f8;
                          }
                          switch((uVar15 + 0x83fffad2) * 0x10000000 | uVar15 + 0x83fffad2 >> 4) {
                          case 0:
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[400];
                            goto LAB_0010eb46;
                          case 1:
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0xb);
                            bVar20 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x192];
                            break;
                          default:
                            if (uVar7 == 0xb0000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x194];
                              goto LAB_0010ebbf;
                            }
                            if (uVar7 == 0xb4000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x193];
                              goto LAB_0010ebbf;
                            }
                            if (local_58 == 0xe800000a) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x196];
                              goto LAB_001111f8;
                            }
                            if (local_58 == 0xe800000b) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x195];
                              goto LAB_001111f8;
                            }
                            if (0x7c00037d < (int)uVar15) {
                              if (uVar15 != 0x7c00072c) {
                                if (uVar15 == 0x7c00037e) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0xb);
                                  bVar20 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x199];
                                }
                                else {
                                  if (uVar15 != 0x7c00073c) goto LAB_0010e0c0;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0xb);
                                  bVar20 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x19c];
                                }
                                break;
                              }
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x19b];
                              goto LAB_0010eb46;
                            }
                            if (uVar15 == 0x7c00032e) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x198];
                              goto LAB_0010eb46;
                            }
                            if (uVar15 == 0x7c00036e) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x197];
                              goto LAB_0010eb46;
                            }
                            if (uVar15 == 0x7c00033e) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x19a];
                              break;
                            }
LAB_0010e0c0:
                            if (uVar7 == 0xbc000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x19d];
                              goto LAB_0010ebbf;
                            }
                            if (uVar15 == 0x7c0005aa) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x19e];
                              goto LAB_0010eb46;
                            }
                            if (uVar15 == 0x7c00052a) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x19f];
                              break;
                            }
                            if (uVar7 == 0x90000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1a1];
                              goto LAB_0010ebbf;
                            }
                            if (uVar7 == 0x94000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1a0];
                              goto LAB_0010ebbf;
                            }
                            if (local_58 == 0xe800000e) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1a3];
                              goto LAB_001111f8;
                            }
                            if (local_58 == 0xe800000f) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1a2];
                              goto LAB_001111f8;
                            }
                            if ((int)uVar15 < 0x7c00016e) {
                              if ((int)uVar15 < 0x7c000110) {
                                if ((int)uVar15 < 0x7c000050) {
                                  if (uVar15 == 0x7c000010) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1b3];
                                  }
                                  else {
                                    if (uVar15 != 0x7c000011) goto LAB_0010e6be;
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1b1];
                                  }
                                }
                                else if (uVar15 == 0x7c000050) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1af];
                                }
                                else {
                                  if (uVar15 != 0x7c000051) goto LAB_0010e6be;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1ad];
                                }
                              }
                              else if ((int)uVar15 < 0x7c00012d) {
                                if (uVar15 == 0x7c000110) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1b7];
                                }
                                else {
                                  if (uVar15 != 0x7c000111) goto LAB_0010e6be;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1b5];
                                }
                              }
                              else if ((int)uVar15 < 0x7c00012e) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1aa];
                              }
                              else {
                                if (uVar15 != 0x7c00012e) {
                                  if (uVar15 == 0x7c00013d) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0xb);
                                    bVar20 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1ab];
                                  }
                                  else {
                                    if (uVar15 != 0x7c00013e) goto LAB_0010e6be;
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0xb);
                                    bVar20 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1a7];
                                  }
                                  break;
                                }
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1a5];
                              }
                              goto LAB_0010eb46;
                            }
                            if ((int)uVar15 < 0x7c000451) {
                              if ((int)uVar15 < 0x7c000410) {
                                if (0x7c00017d < (int)uVar15) {
                                  if (uVar15 == 0x7c00017e) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0xb);
                                    bVar20 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1a6];
                                  }
                                  else if (uVar15 == 0x7c000310) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0xb);
                                    bVar20 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1bb];
                                  }
                                  else {
                                    if (uVar15 != 0x7c000311) goto LAB_0010e6be;
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0xb);
                                    bVar20 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1b9];
                                  }
                                  break;
                                }
                                if (uVar15 != 0x7c00016e) goto LAB_0010e6be;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1a4];
                              }
                              else if (uVar15 == 0x7c000410) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1b0];
                              }
                              else if (uVar15 == 0x7c000411) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1b2];
                              }
                              else {
                                if (uVar15 != 0x7c000450) goto LAB_0010e6be;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1ac];
                              }
                              goto LAB_0010eb46;
                            }
                            if ((int)uVar15 < 0x7c000511) {
                              if (uVar15 == 0x7c000451) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1ae];
                              }
                              else {
                                if (uVar15 != 0x7c000510) goto LAB_0010e6be;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1b4];
                              }
                              goto LAB_0010eb46;
                            }
                            if (0x7c00052b < (int)uVar15) {
                              if (0x7c00053b < (int)uVar15) {
                                if (uVar15 == 0x7c00053c) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0xb);
                                  bVar20 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1a9];
                                }
                                else if (uVar15 == 0x7c000710) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0xb);
                                  bVar20 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1b8];
                                }
                                else {
                                  if (uVar15 != 0x7c000711) goto LAB_0010e6be;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0xb);
                                  bVar20 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1ba];
                                }
                                break;
                              }
                              if (uVar15 != 0x7c00052c) goto LAB_0010e6be;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1a8];
                              goto LAB_0010eb46;
                            }
                            if (uVar15 == 0x7c000511) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1b6];
                              goto LAB_0010eb46;
                            }
LAB_0010e6be:
                            if (uVar7 == 0x20000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1bc];
                              goto LAB_0010e6f1;
                            }
                            if (0x7c00058f < (int)uVar23) {
                              if ((int)uVar23 < 0x7c0005d0) {
                                if (uVar23 == 0x7c000590) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  pvVar17 = local_38[0x1c5];
                                }
                                else {
                                  if (uVar23 != 0x7c000591) goto LAB_0010e997;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  pvVar17 = local_38[0x1c7];
                                }
                              }
                              else if ((int)uVar23 < 0x7c0005d1) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                pvVar17 = local_38[0x1bd];
                              }
                              else {
                                if (0x7c000793 < (int)uVar23) {
                                  if ((int)uVar23 < 0x7c0007d0) {
                                    if (uVar23 == 0x7c000794) {
                                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      resize(&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                      bVar13 = (byte)(uVar22 >> 0x15);
                                      pvVar17 = local_38[0x1c9];
                                    }
                                    else {
                                      if (uVar23 != 0x7c000795) goto LAB_0010e997;
                                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      resize(&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                      bVar13 = (byte)(uVar22 >> 0x15);
                                      pvVar17 = local_38[0x1cb];
                                    }
                                  }
                                  else if (uVar23 == 0x7c0007d0) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1c1];
                                  }
                                  else {
                                    if (uVar23 != 0x7c0007d1) goto LAB_0010e997;
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                    bVar13 = (byte)(uVar22 >> 0x15);
                                    pvVar17 = local_38[0x1c3];
                                  }
                                  goto LAB_0010ee1a;
                                }
                                if (uVar23 != 0x7c0005d1) goto LAB_0010e997;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                pvVar17 = local_38[0x1bf];
                              }
                              goto LAB_0010e976;
                            }
                            if ((int)uVar23 < 0x7c0001d0) {
                              if (uVar23 == 0x7c000190) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                pvVar17 = local_38[0x1c8];
                              }
                              else {
                                if (uVar23 != 0x7c000191) goto LAB_0010e997;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                pvVar17 = local_38[0x1c6];
                              }
                              goto LAB_0010e976;
                            }
                            if ((int)uVar23 < 0x7c0001d1) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              pvVar17 = local_38[0x1c0];
                              goto LAB_0010e976;
                            }
                            if (0x7c000393 < (int)uVar23) {
                              if ((int)uVar23 < 0x7c0003d0) {
                                if (uVar23 == 0x7c000394) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1cc];
                                }
                                else {
                                  if (uVar23 != 0x7c000395) goto LAB_0010e997;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1ca];
                                }
                              }
                              else if (uVar23 == 0x7c0003d0) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1c4];
                              }
                              else {
                                if (uVar23 != 0x7c0003d1) goto LAB_0010e997;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                bVar13 = (byte)(uVar22 >> 0x15);
                                pvVar17 = local_38[0x1c2];
                              }
                              goto LAB_0010ee1a;
                            }
                            if (uVar23 == 0x7c0001d1) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              pvVar17 = local_38[0x1be];
                              goto LAB_0010e976;
                            }
LAB_0010e997:
                            if (uVar16 == 0xac04207c) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (8 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              pvVar17 = local_38[0x1cd];
LAB_0010ebfe:
                              *(void **)(local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -8) = pvVar17;
                              goto LAB_00109f03;
                            }
                            if (uVar15 == 0x7c000088) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1ce];
                              break;
                            }
                            if (uVar7 == 0x8000000) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              *(void **)(local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                                   local_38[0x1cf];
                              local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-2] =
                                   (byte)(uVar22 >> 0x15) & 0x1f;
                              local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1] = bVar18 & 0x1f;
                              *(undefined2 *)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + -4) = uVar21;
                              goto LAB_0010ed2e;
                            }
                            if (uVar25 == 0x7c000624) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              pvVar17 = local_38[0x1d1];
                              goto LAB_0010f3aa;
                            }
                            if (uVar25 == 0x7c000626) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              pvVar17 = local_38[0x1d0];
                              goto LAB_0010f3aa;
                            }
                            switch(uVar15) {
                            case 0x7c000724:
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1d6];
                              break;
                            case 0x7c000725:
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1d4];
                              break;
                            case 0x7c000726:
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1d3];
                              break;
                            case 0x7c000727:
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                        (&local_88,
                                         (size_type)
                                         (local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                              bVar13 = (byte)(uVar22 >> 0xb);
                              bVar20 = (byte)(uVar22 >> 0x15);
                              pvVar17 = local_38[0x1d5];
                              break;
                            default:
                              if (uVar15 == 0x7c000764) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                pvVar17 = local_38[0x1d2];
LAB_00110c20:
                                *(void **)(local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                                     pvVar17;
                                uVar14 = (ushort)(uVar22 >> 0xb) & 0x7fff;
                                goto LAB_0010f1dd;
                              }
                              if (uVar16 == 0x6c02007c) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                          (&local_88,
                                           (size_type)
                                           (local_88.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                pvVar17 = local_38[0x1d7];
                              }
                              else {
                                if (uVar15 == 0x7c000008) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  *(void **)(local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + -0x10) =
                                       local_38[0x1d9];
                                  local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish[-7] =
                                       (byte)(uVar22 >> 0x15) & 0x1f;
                                  local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish[-8] =
                                       (byte)(uVar22 >> 0xf) & 0x3f;
                                  bVar13 = (byte)(uVar22 >> 0xb) & 0xf;
                                  goto LAB_00109f00;
                                }
                                if (uVar15 == 0x7c0007a4) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  pvVar17 = local_38[0x1d8];
                                  goto LAB_00110c20;
                                }
                                if (uVar7 == 0xc000000) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  bVar13 = (byte)(uVar22 >> 0x15);
                                  pvVar17 = local_38[0x1da];
                                  goto LAB_0010ebbf;
                                }
                                if (local_50 == 0x7c000106) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  pvVar17 = local_38[0x1db];
                                  goto LAB_00110917;
                                }
                                if (uVar16 == 0x4601007c) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  pvVar17 = local_38[0x1dd];
                                }
                                else {
                                  if (uVar16 != 0x4681007c) {
                                    if (uVar15 == 0x7c000278) {
                                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      resize(&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                      bVar13 = (byte)(uVar22 >> 0x15);
                                      pvVar17 = local_38[0x1df];
                                    }
                                    else {
                                      if (uVar15 != 0x7c000279) {
                                        if (uVar7 == 0x68000000) {
                                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::resize(&local_88,
                                                   (size_type)
                                                   (local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                          bVar13 = (byte)(uVar22 >> 0x15);
                                          pvVar17 = local_38[0x1e1];
                                        }
                                        else {
                                          if (uVar7 != 0x6c000000) {
                                            if (uVar16 == 0x18) {
                                              std::
                                              vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              ::resize(&local_88,
                                                       (size_type)
                                                       (local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  (8 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                              pvVar17 = local_38[0x1e2];
                                              goto LAB_0010ebfe;
                                            }
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cerr,
                                                       "Unimplemented instruction ",0x1a);
                                            *(uint *)(*(long *)(std::cerr + -0x18) + 0x11b148) =
                                                 *(uint *)(*(long *)(std::cerr + -0x18) + 0x11b148)
                                                 & 0xffffffb5 | 8;
                                            poVar12 = std::ostream::_M_insert<unsigned_long>
                                                                ((ulong)&std::cerr);
                                            std::endl<char,std::char_traits<char>>(poVar12);
                                            unimplemented(this,"unknown during translation",addr);
                                            goto LAB_00109f03;
                                          }
                                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::resize(&local_88,
                                                   (size_type)
                                                   (local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                          bVar13 = (byte)(uVar22 >> 0x15);
                                          pvVar17 = local_38[0x1e0];
                                        }
                                        goto LAB_0010ebbf;
                                      }
                                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                      resize(&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                      bVar13 = (byte)(uVar22 >> 0x15);
                                      pvVar17 = local_38[0x1de];
                                    }
                                    goto LAB_0010eb46;
                                  }
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_88,
                                             (size_type)
                                             (local_88.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                             (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                                  pvVar17 = local_38[0x1dc];
                                }
                              }
                              goto LAB_001109db;
                            }
                            break;
                          case 4:
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[399];
                            goto LAB_0010eb46;
                          case 5:
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_88,
                                       (size_type)
                                       (local_88.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                            bVar13 = (byte)(uVar22 >> 0xb);
                            bVar20 = (byte)(uVar22 >> 0x15);
                            pvVar17 = local_38[0x191];
                          }
                          break;
                        case 0x7c000674:
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0xb);
                          bVar20 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x16c];
                          break;
                        case 0x7c000676:
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_88,
                                     (size_type)
                                     (local_88.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish +
                                     (0x10 - (long)local_88.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
                          bVar13 = (byte)(uVar22 >> 0xb);
                          bVar20 = (byte)(uVar22 >> 0x15);
                          pvVar17 = local_38[0x16b];
                        }
                        goto LAB_0010ed16;
                      case 0x10:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x14e];
                        break;
                      case 0x11:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x150];
                        break;
                      case 0x12:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x154];
                        break;
                      case 0x13:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x156];
                        break;
                      case 0x14:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x158];
                        break;
                      case 0x15:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x15a];
                        break;
                      case 0x16:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x15c];
                        break;
                      case 0x17:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x15e];
                        break;
                      case 0x18:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x14c];
                        break;
                      case 0x19:
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_88,
                                   (size_type)
                                   (local_88.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish +
                                   (0x10 - (long)local_88.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)));
                        bVar13 = (byte)(uVar22 >> 6);
                        bVar20 = (byte)(uVar22 >> 0xb);
                        bVar19 = (byte)(uVar22 >> 0x15);
                        pvVar17 = local_38[0x152];
                      }
LAB_0011117f:
                      *(void **)(local_88.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-4] = bVar19 & 0x1f;
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-3] = bVar18 & 0x1f;
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-2] = bVar20 & 0x1f;
                      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1] = bVar13 & 0x1f;
                      goto LAB_0010ed2e;
                    case 0x7c000016:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x134];
                      goto LAB_0010eb46;
                    case 0x7c000017:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x133];
                      goto LAB_0010eb46;
                    }
                    break;
                  case 4:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x10c];
LAB_0010eb46:
                    *(void **)(local_88.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
                    goto LAB_00109ef7;
                  case 5:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x10e];
                  }
LAB_0010ed16:
                  *(void **)(local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
                  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-4] = bVar20 & 0x1f;
                  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-3] = bVar18 & 0x1f;
                  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish[-2] = bVar13 & 0x1f;
                  goto LAB_0010ed2e;
                case 0x7c0003d6:
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar13 = (byte)(uVar22 >> 0x15);
                  pvVar17 = local_38[0x6b];
                  break;
                case 0x7c0003d7:
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_88,
                             (size_type)
                             (local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                             (0x10 - (long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)));
                  bVar13 = (byte)(uVar22 >> 0x15);
                  pvVar17 = local_38[0x69];
                  break;
                default:
                  switch(uVar15) {
                  case 0x7c000792:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[100];
                    goto LAB_0010ed16;
                  case 0x7c000793:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0xb);
                    bVar20 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x66];
                    goto LAB_0010ed16;
                  case 0x7c000794:
                  case 0x7c000795:
                    goto switchD_0010aace_caseD_7c000394;
                  case 0x7c000796:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x6c];
                    break;
                  case 0x7c000797:
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&local_88,
                               (size_type)
                               (local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish +
                               (0x10 - (long)local_88.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)));
                    bVar13 = (byte)(uVar22 >> 0x15);
                    pvVar17 = local_38[0x6e];
                    break;
                  default:
                    switch(uVar15) {
                    case 0x7c0007d2:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0xb);
                      bVar20 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x60];
                      goto LAB_0010ed16;
                    case 0x7c0007d3:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0xb);
                      bVar20 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x62];
                      goto LAB_0010ed16;
                    default:
                      goto switchD_0010aace_caseD_7c000394;
                    case 0x7c0007d6:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x68];
                      break;
                    case 0x7c0007d7:
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_88,
                                 (size_type)
                                 (local_88.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish +
                                 (0x10 - (long)local_88.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)));
                      bVar13 = (byte)(uVar22 >> 0x15);
                      pvVar17 = local_38[0x6a];
                    }
                  }
                }
                break;
              case 4:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar13 = (byte)(uVar22 >> 0x15);
                pvVar17 = local_38[0x5b];
                break;
              case 5:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_88,
                           (size_type)
                           (local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           (0x10 - (long)local_88.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)));
                bVar13 = (byte)(uVar22 >> 0x15);
                pvVar17 = local_38[0x5a];
              }
              break;
            case 3:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x4b];
              break;
            case 5:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x51];
              break;
            case 6:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x4d];
              break;
            case 7:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x4a];
              break;
            case 8:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x4c];
              break;
            case 0xc:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x50];
              break;
            case 0xd:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_88,
                         (size_type)
                         (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                         (0x10 - (long)local_88.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start)));
              bVar13 = (byte)(uVar22 >> 0x15);
              pvVar17 = local_38[0x4f];
            }
LAB_00109eed:
            *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-8] = bVar13 & 0x1f;
LAB_00109ef7:
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-7] = bVar18 & 0x1f;
            bVar13 = (byte)(uVar22 >> 0xb) & 0x1f;
LAB_00109f00:
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish[-6] = bVar13;
            goto LAB_00109f03;
          }
        }
LAB_0010ee1a:
        *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -0x10) = pvVar17;
        bVar13 = bVar13 & 0x1f;
LAB_0010ee21:
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-4] = bVar13;
        bVar18 = bVar18 & 0x1f;
LAB_0010ee27:
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish[-3] = bVar18;
        goto LAB_0010ed2e;
      }
      *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -0x10) = pvVar17;
      goto LAB_0010f1ce;
    }
    *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + -0x10) = pvVar17;
    bVar13 = bVar13 & 0x1f;
LAB_0010f1ce:
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish[-2] = bVar13;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = bVar18 & 0x1f;
    uVar14 = (ushort)(uVar3 >> 2);
LAB_0010f1dd:
    *(ushort *)
     (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish + -4) = uVar14;
    goto LAB_0010ed2e;
  }
  *(void **)(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + -0x10) = pvVar17;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish[-6] = bVar13 & 0x1f;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish[-5] = bVar18 & 0x1f;
LAB_0010a024:
  *(undefined2 *)
   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish + -8) = uVar21;
LAB_00109f03:
  addr = addr + 4;
  goto LAB_00109b98;
}

Assistant:

uint8_t *PowerCore::fetchBlock(uint32_t blockAddr)
{
    auto it = blocks.find(blockAddr);
    if(it != blocks.end())
    {
        //std::cout << "Again at " << std::hex << blockAddr << std::endl;
        return it->second.data();
    }
    std::vector<uint8_t> block;

    //std::cout << "First time at " << std::hex << blockAddr << std::endl;

    auto allocOpcode = [&](unsigned sz) {
        block.resize(block.size() + sz);
        return block.data() + block.size() - sz;
    };

    uint32_t breakpoint = 0xFFFFFFFF;
    if(getNextBreakpoint)
        breakpoint = getNextBreakpoint(blockAddr);

    void ** opcodes;
    interpret2(&opcodes);
    auto makeOpcode = [opcodes](int idx) { return opcodes[idx]; };

    uint32_t addr = blockAddr;
    for(;;)
    {
        if(addr == breakpoint)
        {
            Opcode_breakpoint& translated = *reinterpret_cast<Opcode_breakpoint*>(allocOpcode(sizeof(Opcode_breakpoint)));
            translated.opcode = makeOpcode(-1);
            translated.CIA = addr;
            breakpoint = getNextBreakpoint(addr + 4);
        }
        uint32_t insn = load<uint32_t>(addr);
        if(false)
            ;
#include "generated.translate.h"
        else
        {
            std::cerr << "Unimplemented instruction " << std::hex << insn << std::endl;
            unimplemented("unknown during translation", addr);
        }
        addr += 4;
    }